

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O0

void __thiscall YAML::EmitterState::EndedGroup(EmitterState *this,value type)

{
  bool bVar1;
  pointer pGVar2;
  value in_ESI;
  long in_RDI;
  size_t lastIndent;
  unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
  pFinishedGroup;
  string *in_stack_fffffffffffffec8;
  EmitterState *in_stack_fffffffffffffed0;
  size_t sVar3;
  allocator *in_stack_fffffffffffffee0;
  allocator local_e9;
  string local_e8 [47];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [36];
  value local_c;
  
  local_c = in_ESI;
  bVar1 = std::
          vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
          ::empty((vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
                   *)in_stack_fffffffffffffee0);
  if (bVar1) {
    if (local_c == Seq) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"unexpected end sequence token",&local_31);
      SetError(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"unexpected end map token",&local_69);
      SetError(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
  }
  else {
    if ((*(byte *)(in_RDI + 0xd2) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"invalid tag",&local_91);
      SetError(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    if ((*(byte *)(in_RDI + 0xd0) & 1) != 0) {
      in_stack_fffffffffffffee0 = &local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"invalid anchor",in_stack_fffffffffffffee0);
      SetError(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    std::
    vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
    ::back((vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
            *)in_stack_fffffffffffffed0);
    std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>::
    unique_ptr((unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                *)in_stack_fffffffffffffed0,
               (unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                *)in_stack_fffffffffffffec8);
    std::
    vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
    ::pop_back((vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
                *)0xefbc0e);
    pGVar2 = std::
             unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
             ::operator->((unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                           *)0xefbc18);
    bVar1 = pGVar2->type == local_c;
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"unmatched group tag",&local_e9);
      SetError(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>::
    ~unique_ptr((unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                 *)in_stack_fffffffffffffed0);
    if (bVar1) {
      bVar1 = std::
              vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
              ::empty((vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
                       *)in_stack_fffffffffffffee0);
      if (bVar1) {
        sVar3 = 0;
      }
      else {
        std::
        vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
        ::back((vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
                *)in_stack_fffffffffffffed0);
        pGVar2 = std::
                 unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                 ::operator->((unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                               *)0xefbd24);
        sVar3 = pGVar2->indent;
      }
      *(size_t *)(in_RDI + 200) = *(long *)(in_RDI + 200) - sVar3;
      SettingChanges::restore((SettingChanges *)in_stack_fffffffffffffee0);
      ClearModifiedSettings((EmitterState *)0xefbd68);
      *(undefined1 *)(in_RDI + 0xd0) = 0;
      *(undefined1 *)(in_RDI + 0xd2) = 0;
      *(undefined1 *)(in_RDI + 0xd3) = 0;
    }
  }
  return;
}

Assistant:

void EmitterState::EndedGroup(GroupType::value type) {
  if (m_groups.empty()) {
    if (type == GroupType::Seq) {
      return SetError(ErrorMsg::UNEXPECTED_END_SEQ);
    }
    return SetError(ErrorMsg::UNEXPECTED_END_MAP);
  }

  if (m_hasTag) {
    SetError(ErrorMsg::INVALID_TAG);
  }
  if (m_hasAnchor) {
    SetError(ErrorMsg::INVALID_ANCHOR);
  }

  // get rid of the current group
  {
    std::unique_ptr<Group> pFinishedGroup = std::move(m_groups.back());
    m_groups.pop_back();
    if (pFinishedGroup->type != type) {
      return SetError(ErrorMsg::UNMATCHED_GROUP_TAG);
    }
  }

  // reset old settings
  std::size_t lastIndent = (m_groups.empty() ? 0 : m_groups.back()->indent);
  assert(m_curIndent >= lastIndent);
  m_curIndent -= lastIndent;

  // some global settings that we changed may have been overridden
  // by a local setting we just popped, so we need to restore them
  m_globalModifiedSettings.restore();

  ClearModifiedSettings();
  m_hasAnchor = false;
  m_hasTag = false;
  m_hasNonContent = false;
}